

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawList *this;
  float *pfVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  byte bVar5;
  int i;
  int iVar6;
  int iVar7;
  ImGuiTextBuffer *this_00;
  char *pcVar8;
  ImVec2 IVar9;
  ImFontAtlas *pIVar10;
  ImGuiWindow *pIVar11;
  ImGuiWindow *pIVar12;
  ulong uVar13;
  ImGuiWindow **__dest;
  ImGuiPopupRef *pIVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  char cVar17;
  ImGuiID IVar18;
  long lVar19;
  ulong uVar20;
  int m;
  ImGuiWindow **ppIVar21;
  ulong uVar22;
  ImGuiPopupRef *pIVar23;
  uint uVar24;
  char *pcVar25;
  char *pcVar26;
  bool bVar27;
  uint uVar28;
  float fVar29;
  ImVec2 IVar30;
  ImVec2 IVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float y;
  int file_size;
  char name [64];
  float local_a4;
  int local_a0;
  int local_9c;
  ImVec2 local_98;
  undefined8 uStack_90;
  char *local_88;
  ImGuiContext *local_80;
  ImVec2 local_78 [9];
  
  pIVar16 = GImGui;
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x818,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x819,"void ImGui::NewFrame()");
  }
  pIVar10 = (GImGui->IO).Fonts;
  if ((pIVar10->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81a,"void ImGui::NewFrame()");
  }
  if ((*(pIVar10->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81b,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81c,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    this_00 = (ImGuiTextBuffer *)(*(pIVar16->IO).MemAllocFn)(0x10);
    pIVar16->LogClipboard = this_00;
    ImGuiTextBuffer::ImGuiTextBuffer(this_00);
    if ((pIVar16->Settings).Size != 0) {
      __assert_fail("g.Settings.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x824,"void ImGui::NewFrame()");
    }
    local_80 = GImGui;
    pcVar8 = (GImGui->IO).IniFilename;
    if ((pcVar8 != (char *)0x0) &&
       (pcVar8 = (char *)ImLoadFileToMemory(pcVar8,"rb",&local_9c,1), local_88 = pcVar8,
       pcVar8 != (char *)0x0)) {
      if (0 < (long)local_9c) {
        pcVar25 = pcVar8 + local_9c;
        IVar9.x = 0.0;
        IVar9.y = 0.0;
        pcVar26 = pcVar8;
LAB_00121be3:
        do {
          if ((*pcVar8 != '\n') && (*pcVar8 != '\r')) {
            pcVar8 = pcVar8 + 1;
            if (pcVar8 < pcVar25) goto LAB_00121be3;
          }
          if (((pcVar26 < pcVar8) && (*pcVar26 == '[')) && (pcVar8[-1] == ']')) {
            ImFormatString((char *)local_78,0x40,"%.*s",(ulong)(((int)pcVar8 - (int)pcVar26) - 2),
                           pcVar26 + 1);
            IVar9 = (ImVec2)FindWindowSettings((char *)local_78);
            if (IVar9 == (ImVec2)0x0) {
              IVar9 = (ImVec2)AddWindowSettings((char *)local_78);
            }
          }
          else if (IVar9 == (ImVec2)0x0) {
            IVar9.x = 0.0;
            IVar9.y = 0.0;
          }
          else {
            local_98 = IVar9;
            iVar6 = __isoc99_sscanf(pcVar26,"Pos=%f,%f",local_78);
            if (iVar6 == 2) {
              ((ImVec2 *)((long)local_98 + 0xc))->x = local_78[0].x;
              *(float *)((long)local_98 + 0x10) = local_a4;
              IVar9 = local_98;
            }
            else {
              iVar6 = __isoc99_sscanf(pcVar26,"Size=%f,%f",local_78,&local_a4);
              if (iVar6 == 2) {
                IVar9 = (local_80->Style).WindowMinSize;
                fVar34 = IVar9.x;
                fVar29 = IVar9.y;
                uVar24 = -(uint)(fVar34 <= local_78[0].x);
                uVar28 = -(uint)(fVar29 <= local_a4);
                *(ulong *)((long)local_98 + 0x14) =
                     CONCAT44(~uVar28 & (uint)fVar29,~uVar24 & (uint)fVar34) |
                     CONCAT44((uint)local_a4 & uVar28,(uint)local_78[0].x & uVar24);
                IVar9 = local_98;
              }
              else {
                iVar6 = __isoc99_sscanf(pcVar26,"Collapsed=%d",&local_a0);
                IVar9 = local_98;
                if (iVar6 == 1) {
                  *(bool *)((long)local_98 + 0x1c) = local_a0 != 0;
                }
              }
            }
          }
          pcVar8 = pcVar8 + 1;
          pcVar26 = pcVar8;
        } while (pcVar8 < pcVar25);
      }
      pIVar15 = GImGui;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar15->IO).MemFreeFn)(local_88);
    }
    pIVar16->Initialized = true;
    pIVar10 = (pIVar16->IO).Fonts;
    if ((pIVar10->Fonts).Size < 1) {
      pcVar8 = "value_type &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001229cf:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                    ,0x35b,pcVar8);
    }
  }
  SetCurrentFont(*(pIVar10->Fonts).Data);
  pIVar16->Time = (pIVar16->IO).DeltaTime + pIVar16->Time;
  pIVar16->FrameCount = pIVar16->FrameCount + 1;
  pIVar16->Tooltip[0] = '\0';
  this = &pIVar16->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,&((pIVar16->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar16->RenderDrawData).Valid = false;
  (pIVar16->RenderDrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar16->RenderDrawData).CmdListsCount = 0;
  (pIVar16->RenderDrawData).TotalVtxCount = 0;
  (pIVar16->RenderDrawData).TotalIdxCount = 0;
  fVar34 = (pIVar16->IO).MousePos.x;
  if ((0.0 <= fVar34) || (pfVar2 = &(pIVar16->IO).MousePos.y, 0.0 < *pfVar2 || *pfVar2 == 0.0)) {
    if (fVar34 < 0.0) goto LAB_00121e13;
LAB_00121e1d:
    IVar9 = (pIVar16->IO).MousePosPrev;
    fVar29 = IVar9.x;
    fVar35 = IVar9.y;
    if ((fVar29 < 0.0) && (fVar35 < 0.0)) goto LAB_00121e3a;
    IVar30.x = fVar34 - fVar29;
    IVar30.y = (pIVar16->IO).MousePos.y - fVar35;
    (pIVar16->IO).MouseDelta = IVar30;
  }
  else {
    (pIVar16->IO).MousePos.x = -9999.0;
    (pIVar16->IO).MousePos.y = -9999.0;
    fVar34 = -9999.0;
LAB_00121e13:
    pfVar2 = &(pIVar16->IO).MousePos.y;
    if (0.0 < *pfVar2 || *pfVar2 == 0.0) goto LAB_00121e1d;
LAB_00121e3a:
    (pIVar16->IO).MouseDelta.x = 0.0;
    (pIVar16->IO).MouseDelta.y = 0.0;
  }
  IVar9 = (pIVar16->IO).MousePos;
  (pIVar16->IO).MousePosPrev = IVar9;
  lVar19 = 0;
  do {
    if ((pIVar16->IO).MouseDown[lVar19] == true) {
      fVar34 = (pIVar16->IO).MouseDownDuration[lVar19];
      (pIVar16->IO).MouseClicked[lVar19] = fVar34 < 0.0;
      (pIVar16->IO).MouseReleased[lVar19] = false;
      (pIVar16->IO).MouseDownDurationPrev[lVar19] = fVar34;
      if (0.0 <= fVar34) {
        (pIVar16->IO).MouseDownDuration[lVar19] = fVar34 + (pIVar16->IO).DeltaTime;
        (pIVar16->IO).MouseDoubleClicked[lVar19] = false;
        fVar34 = (pIVar16->IO).MouseDragMaxDistanceSqr[lVar19];
        fVar29 = IVar9.x - (pIVar16->IO).MouseClickedPos[lVar19].x;
        fVar35 = IVar9.y - (pIVar16->IO).MouseClickedPos[lVar19].y;
        fVar29 = fVar29 * fVar29 + fVar35 * fVar35;
        uVar24 = -(uint)(fVar29 <= fVar34);
        (pIVar16->IO).MouseDragMaxDistanceSqr[lVar19] =
             (float)(uVar24 & (uint)fVar34 | ~uVar24 & (uint)fVar29);
      }
      else {
        (pIVar16->IO).MouseDownDuration[lVar19] = 0.0;
        (pIVar16->IO).MouseDoubleClicked[lVar19] = false;
        fVar34 = pIVar16->Time;
        if ((fVar34 - (pIVar16->IO).MouseClickedTime[lVar19] < (pIVar16->IO).MouseDoubleClickTime)
           && (fVar35 = IVar9.x - (pIVar16->IO).MouseClickedPos[lVar19].x,
              fVar36 = IVar9.y - (pIVar16->IO).MouseClickedPos[lVar19].y,
              fVar29 = (pIVar16->IO).MouseDoubleClickMaxDist, fVar34 = -3.4028235e+38,
              fVar35 * fVar35 + fVar36 * fVar36 < fVar29 * fVar29)) {
          (pIVar16->IO).MouseDoubleClicked[lVar19] = true;
          fVar34 = -3.4028235e+38;
        }
        (pIVar16->IO).MouseClickedTime[lVar19] = fVar34;
        (pIVar16->IO).MouseClickedPos[lVar19] = IVar9;
        (pIVar16->IO).MouseDragMaxDistanceSqr[lVar19] = 0.0;
      }
    }
    else {
      (pIVar16->IO).MouseClicked[lVar19] = false;
      fVar34 = (pIVar16->IO).MouseDownDuration[lVar19];
      (pIVar16->IO).MouseReleased[lVar19] = 0.0 <= fVar34;
      (pIVar16->IO).MouseDownDurationPrev[lVar19] = fVar34;
      (pIVar16->IO).MouseDownDuration[lVar19] = -1.0;
      (pIVar16->IO).MouseDoubleClicked[lVar19] = false;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  pfVar2 = (pIVar16->IO).KeysDownDuration;
  memcpy((pIVar16->IO).KeysDownDurationPrev,pfVar2,0x800);
  lVar19 = 0;
  do {
    fVar34 = -1.0;
    if ((pIVar16->IO).KeysDown[lVar19] == true) {
      fVar34 = 0.0;
      if (0.0 <= pfVar2[lVar19]) {
        fVar34 = pfVar2[lVar19] + (pIVar16->IO).DeltaTime;
      }
    }
    pfVar2[lVar19] = fVar34;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x200);
  fVar34 = (pIVar16->IO).DeltaTime;
  iVar6 = pIVar16->FramerateSecPerFrameIdx;
  pIVar16->FramerateSecPerFrameAccum =
       (fVar34 - pIVar16->FramerateSecPerFrame[iVar6]) + pIVar16->FramerateSecPerFrameAccum;
  pIVar16->FramerateSecPerFrame[iVar6] = fVar34;
  iVar7 = iVar6 + (int)((ulong)((long)(iVar6 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar16->FramerateSecPerFrameIdx = iVar6 + 1 + ((iVar7 >> 6) - (iVar7 >> 0x1f)) * -0x78;
  (pIVar16->IO).Framerate = 1.0 / (pIVar16->FramerateSecPerFrameAccum / 120.0);
  pIVar16->HoveredIdPreviousFrame = pIVar16->HoveredId;
  pIVar16->HoveredId = 0;
  pIVar16->HoveredIdAllowOverlap = false;
  pIVar15 = GImGui;
  if ((pIVar16->ActiveIdIsAlive == false) &&
     (pIVar16->ActiveId != 0 && pIVar16->ActiveIdPreviousFrame == pIVar16->ActiveId)) {
    GImGui->ActiveId = 0;
    pIVar15->ActiveIdIsJustActivated = true;
    pIVar15->ActiveIdAllowOverlap = false;
    pIVar15->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar3 = pIVar16->ActiveId;
  IVar18 = pIVar16->MovedWindowMoveId;
  pIVar16->ActiveIdPreviousFrame = IVar3;
  pIVar16->ActiveIdIsAlive = false;
  pIVar15 = GImGui;
  pIVar16->ActiveIdIsJustActivated = false;
  if (IVar18 == IVar3 && IVar18 != 0) {
    if (GImGui->ActiveId == IVar3) {
      GImGui->ActiveIdIsAlive = true;
    }
    pIVar11 = pIVar16->MovedWindow;
    if ((pIVar11 == (ImGuiWindow *)0x0) || (pIVar11->RootWindow == (ImGuiWindow *)0x0)) {
      __assert_fail("g.MovedWindow && g.MovedWindow->RootWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x872,"void ImGui::NewFrame()");
    }
    if (pIVar11->RootWindow->MoveId != IVar3) {
      __assert_fail("g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x873,"void ImGui::NewFrame()");
    }
    if ((pIVar16->IO).MouseDown[0] == true) {
      if ((((pIVar11->Flags & 4U) == 0) &&
          (IVar9 = (pIVar16->IO).MouseDelta, IVar31.x = (pIVar11->PosFloat).x + IVar9.x,
          IVar31.y = (pIVar11->PosFloat).y + IVar9.y, pIVar11->PosFloat = IVar31,
          ((uint)pIVar11->Flags >> 8 & 1) == 0)) && (pIVar15->SettingsDirtyTimer <= 0.0)) {
        pIVar15->SettingsDirtyTimer = (pIVar15->IO).IniSavingRate;
      }
      FocusWindow(pIVar11);
    }
    else {
      pIVar15->ActiveId = 0;
      pIVar15->ActiveIdIsJustActivated = true;
      pIVar15->ActiveIdAllowOverlap = false;
      pIVar15->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar16->MovedWindow = (ImGuiWindow *)0x0;
      pIVar16->MovedWindowMoveId = 0;
    }
  }
  else {
    pIVar16->MovedWindow = (ImGuiWindow *)0x0;
    pIVar16->MovedWindowMoveId = 0;
  }
  if ((0.0 < pIVar16->SettingsDirtyTimer) &&
     (fVar34 = pIVar16->SettingsDirtyTimer - (pIVar16->IO).DeltaTime,
     pIVar16->SettingsDirtyTimer = fVar34, fVar34 <= 0.0)) {
    SaveSettings();
  }
  pIVar11 = pIVar16->MovedWindow;
  if (pIVar11 == (ImGuiWindow *)0x0) {
    local_98 = (pIVar16->IO).MousePos;
    uStack_90 = 0;
    pIVar11 = FindHoveredWindow(local_98,false);
    pIVar16->HoveredWindow = pIVar11;
    if ((pIVar11 != (ImGuiWindow *)0x0) && ((pIVar11->Flags & 0x100000) != 0)) goto LAB_001222a9;
    pIVar12 = FindHoveredWindow(local_98,true);
  }
  else {
    pIVar16->HoveredWindow = pIVar11;
LAB_001222a9:
    pIVar12 = pIVar11->RootWindow;
  }
  pIVar16->HoveredRootWindow = pIVar12;
  pIVar12 = GetFrontMostModalRootWindow();
  if (pIVar12 == (ImGuiWindow *)0x0) {
    pIVar16->ModalWindowDarkeningRatio = 0.0;
  }
  else {
    fVar34 = (pIVar16->IO).DeltaTime * 6.0 + pIVar16->ModalWindowDarkeningRatio;
    if (1.0 <= fVar34) {
      fVar34 = 1.0;
    }
    pIVar16->ModalWindowDarkeningRatio = fVar34;
    ppIVar21 = &pIVar16->HoveredRootWindow;
    do {
      pIVar4 = *ppIVar21;
      if (pIVar4 == (ImGuiWindow *)0x0) break;
      ppIVar21 = &pIVar4->ParentWindow;
    } while (pIVar4 != pIVar12);
    if (pIVar4 == (ImGuiWindow *)0x0) {
      pIVar11 = (ImGuiWindow *)0x0;
      pIVar16->HoveredWindow = (ImGuiWindow *)0x0;
      pIVar16->HoveredRootWindow = (ImGuiWindow *)0x0;
    }
  }
  iVar6 = -1;
  lVar19 = 0;
  bVar5 = 0;
  do {
    if ((pIVar16->IO).MouseClicked[lVar19] == true) {
      bVar27 = true;
      if (pIVar11 == (ImGuiWindow *)0x0) {
        bVar27 = (pIVar16->OpenPopupStack).Size != 0;
      }
      (pIVar16->IO).MouseDownOwned[lVar19] = bVar27;
    }
    bVar27 = (pIVar16->IO).MouseDown[lVar19];
    if ((bVar27 == true) &&
       ((iVar6 == -1 ||
        (fVar34 = (pIVar16->IO).MouseClickedTime[iVar6],
        pfVar2 = (pIVar16->IO).MouseClickedTime + lVar19, *pfVar2 <= fVar34 && fVar34 != *pfVar2))))
    {
      iVar6 = (int)lVar19;
    }
    bVar5 = bVar5 & 1 | bVar27;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  if (iVar6 == -1) {
    iVar6 = pIVar16->CaptureMouseNextFrame;
    cVar17 = '\x01';
    if (iVar6 == -1) {
LAB_0012240c:
      cVar17 = '\x01';
      bVar27 = true;
      if ((pIVar11 == (ImGuiWindow *)0x0) && (bVar5 == 0)) goto LAB_00122419;
      goto LAB_00122430;
    }
LAB_00122400:
    (pIVar16->IO).WantCaptureMouse = iVar6 != 0;
  }
  else {
    cVar17 = (pIVar16->IO).MouseDownOwned[iVar6];
    iVar6 = pIVar16->CaptureMouseNextFrame;
    if (iVar6 != -1) goto LAB_00122400;
    if ((bool)cVar17 != false) goto LAB_0012240c;
    cVar17 = '\0';
LAB_00122419:
    bVar27 = true;
    if (pIVar16->ActiveId == 0) {
      bVar27 = (pIVar16->OpenPopupStack).Size != 0;
    }
LAB_00122430:
    (pIVar16->IO).WantCaptureMouse = bVar27;
  }
  IVar3 = pIVar16->ActiveId;
  IVar18 = pIVar16->CaptureKeyboardNextFrame;
  if (pIVar16->CaptureKeyboardNextFrame == 0xffffffff) {
    IVar18 = IVar3;
  }
  (pIVar16->IO).WantCaptureKeyboard = IVar18 != 0;
  if (IVar3 == 0) {
    bVar27 = false;
  }
  else {
    bVar27 = (pIVar16->InputTextState).Id == IVar3;
  }
  (pIVar16->IO).WantTextInput = bVar27;
  pIVar16->MouseCursor = 0;
  pIVar16->CaptureMouseNextFrame = -1;
  pIVar16->CaptureKeyboardNextFrame = -1;
  (pIVar16->OsImePosRequest).x = 1.0;
  (pIVar16->OsImePosRequest).y = 1.0;
  if (cVar17 == '\0') {
    pIVar16->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar16->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  else {
    pIVar11 = pIVar16->HoveredWindow;
    if (pIVar11 != (ImGuiWindow *)0x0) {
      fVar34 = (pIVar16->IO).MouseWheel;
      if (((fVar34 != 0.0) || (NAN(fVar34))) && (pIVar11->Collapsed == false)) {
        if ((pIVar16->IO).KeyCtrl == true) {
          if ((pIVar16->IO).FontAllowUserScaling == true) {
            fVar29 = fVar34 * 0.1 + pIVar11->FontWindowScale;
            fVar34 = 2.5;
            if (fVar29 <= 2.5) {
              fVar34 = fVar29;
            }
            fVar34 = (float)(-(uint)(fVar29 < 0.5) & 0x3f000000 |
                            ~-(uint)(fVar29 < 0.5) & (uint)fVar34);
            fVar35 = fVar34 / pIVar11->FontWindowScale;
            pIVar11->FontWindowScale = fVar34;
            fVar34 = 1.0 - fVar35;
            IVar9 = pIVar11->Size;
            auVar33._8_8_ = 0;
            auVar33._0_4_ = IVar9.x;
            auVar33._4_4_ = IVar9.y;
            IVar30 = (pIVar16->IO).MousePos;
            auVar32._0_4_ = (IVar30.x - (pIVar11->Pos).x) * fVar34 * IVar9.x;
            auVar32._4_4_ = (IVar30.y - (pIVar11->Pos).y) * fVar34 * IVar9.y;
            auVar32._8_4_ = fVar34 * 0.0 * 0.0;
            auVar32._12_4_ = fVar34 * 0.0 * 0.0;
            auVar33 = divps(auVar32,auVar33);
            fVar34 = (pIVar11->Pos).x;
            fVar29 = (pIVar11->Pos).y;
            (pIVar11->PosFloat).x = (pIVar11->PosFloat).x + auVar33._0_4_;
            (pIVar11->PosFloat).y = (pIVar11->PosFloat).y + auVar33._4_4_;
            (pIVar11->Pos).x = fVar34 + auVar33._0_4_;
            (pIVar11->Pos).y = fVar29 + auVar33._4_4_;
            fVar34 = (pIVar11->SizeFull).x;
            fVar29 = (pIVar11->SizeFull).y;
            (pIVar11->Size).x = fVar35 * (pIVar11->Size).x;
            (pIVar11->Size).y = fVar35 * (pIVar11->Size).y;
            (pIVar11->SizeFull).x = fVar35 * fVar34;
            (pIVar11->SizeFull).y = fVar35 * fVar29;
          }
        }
        else if ((pIVar11->Flags & 0x10U) == 0) {
          fVar29 = (pIVar11->Scroll).y;
          fVar35 = (pIVar11->DC).CursorMaxPos.y;
          fVar34 = fVar29 - GImGui->FontBaseSize * pIVar11->FontWindowScale * fVar34 *
                            (float)(byte)((((uint)pIVar11->Flags >> 0x17 & 1) == 0) * '\x02' + 3);
          (pIVar11->Scroll).y = fVar34;
          (pIVar11->DC).CursorMaxPos.y = (fVar29 + fVar35) - fVar34;
        }
      }
    }
  }
  if (((IVar3 == 0) && (pIVar16->FocusedWindow != (ImGuiWindow *)0x0)) &&
     ((pIVar16->FocusedWindow->Active == true &&
      (bVar27 = IsKeyPressed((GImGui->IO).KeyMap[0],false), bVar27)))) {
    pIVar16->FocusedWindow->FocusIdxTabRequestNext = 0;
  }
  uVar24 = (pIVar16->Windows).Size;
  uVar13 = (ulong)uVar24;
  if (uVar13 != 0) {
    uVar20 = 0;
    if (0 < (int)uVar24) {
      uVar20 = (ulong)uVar24;
    }
    uVar22 = 0;
    do {
      if (uVar20 == uVar22) {
        pcVar8 = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001229cf;
      }
      pIVar11 = (pIVar16->Windows).Data[uVar22];
      pIVar11->WasActive = pIVar11->Active;
      pIVar11->Active = false;
      pIVar11->Accessed = false;
      uVar22 = uVar22 + 1;
    } while (uVar13 != uVar22);
  }
  if (((pIVar16->FocusedWindow != (ImGuiWindow *)0x0) && (0 < (int)uVar24)) &&
     (pIVar16->FocusedWindow->WasActive == false)) {
    uVar13 = uVar13 + 1;
    do {
      pIVar11 = (pIVar16->Windows).Data[uVar13 - 2];
      if ((pIVar11->WasActive == true) && ((pIVar11->Flags & 0x100000) == 0)) {
        FocusWindow(pIVar11);
        break;
      }
      uVar13 = uVar13 - 1;
    } while (1 < uVar13);
  }
  pIVar15 = GImGui;
  if ((pIVar16->CurrentWindowStack).Capacity < 0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiWindow **)(*(pIVar15->IO).MemAllocFn)(0);
    ppIVar21 = (pIVar16->CurrentWindowStack).Data;
    if (ppIVar21 == (ImGuiWindow **)0x0) {
LAB_001226e2:
      ppIVar21 = (ImGuiWindow **)0x0;
      pIVar15 = GImGui;
    }
    else {
      memcpy(__dest,ppIVar21,(long)(pIVar16->CurrentWindowStack).Size << 3);
      pIVar15 = GImGui;
      ppIVar21 = (pIVar16->CurrentWindowStack).Data;
      if (ppIVar21 == (ImGuiWindow **)0x0) goto LAB_001226e2;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar15->IO).MemFreeFn)(ppIVar21);
    (pIVar16->CurrentWindowStack).Data = __dest;
    (pIVar16->CurrentWindowStack).Capacity = 0;
  }
  pIVar15 = GImGui;
  (pIVar16->CurrentWindowStack).Size = 0;
  if ((pIVar16->CurrentPopupStack).Capacity < 0) {
    piVar1 = &(pIVar15->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar14 = (ImGuiPopupRef *)(*(pIVar15->IO).MemAllocFn)(0);
    pIVar23 = (pIVar16->CurrentPopupStack).Data;
    if (pIVar23 == (ImGuiPopupRef *)0x0) {
LAB_00122770:
      pIVar23 = (ImGuiPopupRef *)0x0;
      pIVar15 = GImGui;
    }
    else {
      memcpy(pIVar14,pIVar23,(long)(pIVar16->CurrentPopupStack).Size * 0x28);
      pIVar15 = GImGui;
      pIVar23 = (pIVar16->CurrentPopupStack).Data;
      if (pIVar23 == (ImGuiPopupRef *)0x0) goto LAB_00122770;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar15->IO).MemFreeFn)(pIVar23);
    (pIVar16->CurrentPopupStack).Data = pIVar14;
    (pIVar16->CurrentPopupStack).Capacity = 0;
    pIVar15 = GImGui;
  }
  (pIVar16->CurrentPopupStack).Size = 0;
  uVar24 = (pIVar15->OpenPopupStack).Size;
  uVar13 = (ulong)uVar24;
  if (uVar13 == 0) goto LAB_00122904;
  uVar20 = 0;
  if (0 < (int)uVar24 && pIVar15->FocusedWindow != (ImGuiWindow *)0x0) {
    pIVar23 = (pIVar15->OpenPopupStack).Data;
    uVar20 = 0;
LAB_001227d1:
    pIVar11 = pIVar23[uVar20].Window;
    if (pIVar11 != (ImGuiWindow *)0x0) {
      if (((uint)pIVar11->Flags >> 0x19 & 1) == 0) {
        __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                      ,0xd42,"void CloseInactivePopups()");
      }
      uVar22 = uVar20;
      if (((uint)pIVar11->Flags >> 0x14 & 1) == 0) {
        do {
          if (pIVar11 == (ImGuiWindow *)0x0) {
            if (uVar13 <= uVar22 + 1) goto LAB_0012283c;
          }
          else {
            pIVar12 = pIVar15->FocusedWindow->RootWindow;
            if ((uVar13 <= uVar22 + 1) || (pIVar11->RootWindow == pIVar12)) goto LAB_0012282a;
          }
          pIVar11 = pIVar23[uVar22 + 1].Window;
          uVar22 = uVar22 + 1;
        } while( true );
      }
    }
    goto LAB_0012282f;
  }
LAB_0012283c:
  iVar6 = (int)uVar20;
  if ((int)uVar24 <= iVar6) goto LAB_00122904;
  iVar7 = (pIVar15->OpenPopupStack).Capacity;
  pIVar16 = pIVar15;
  if (iVar7 < iVar6) {
    if (iVar7 == 0) {
      uVar24 = 8;
    }
    else {
      uVar24 = iVar7 / 2 + iVar7;
    }
    uVar13 = (ulong)uVar24;
    if ((int)uVar24 <= iVar6) {
      uVar13 = uVar20 & 0xffffffff;
    }
    piVar1 = &(pIVar15->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar14 = (ImGuiPopupRef *)(*(pIVar15->IO).MemAllocFn)(uVar13 * 0x28);
    pIVar23 = (pIVar15->OpenPopupStack).Data;
    if (pIVar23 == (ImGuiPopupRef *)0x0) {
LAB_001228dd:
      pIVar23 = (ImGuiPopupRef *)0x0;
      pIVar16 = GImGui;
    }
    else {
      memcpy(pIVar14,pIVar23,(long)(pIVar15->OpenPopupStack).Size * 0x28);
      pIVar16 = GImGui;
      pIVar23 = (pIVar15->OpenPopupStack).Data;
      if (pIVar23 == (ImGuiPopupRef *)0x0) goto LAB_001228dd;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar16->IO).MemFreeFn)(pIVar23);
    (pIVar15->OpenPopupStack).Data = pIVar14;
    (pIVar15->OpenPopupStack).Capacity = (int)uVar13;
    pIVar16 = GImGui;
  }
  (pIVar15->OpenPopupStack).Size = iVar6;
  pIVar15 = pIVar16;
LAB_00122904:
  (pIVar15->SetNextWindowSizeVal).x = 400.0;
  (pIVar15->SetNextWindowSizeVal).y = 400.0;
  pIVar15->SetNextWindowSizeCond = 4;
  local_78[0].x = 0.0;
  local_78[0].y = 0.0;
  Begin("Debug",(bool *)0x0,local_78,-1.0,0);
  return;
LAB_0012282a:
  if (pIVar11->RootWindow != pIVar12) goto LAB_0012283c;
LAB_0012282f:
  uVar20 = uVar20 + 1;
  if (uVar20 == uVar13) goto LAB_00122904;
  goto LAB_001227d1;
}

Assistant:

void ImGui::NewFrame()
{
    ImGuiContext& g = *GImGui;

    // Check user data
    IM_ASSERT(g.IO.DeltaTime >= 0.0f);               // Need a positive DeltaTime (zero is tolerated but will cause some timing issues)
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f);
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0);           // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded());     // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f);  // Invalid style setting

    if (!g.Initialized)
    {
        // Initialize on first frame
        g.LogClipboard = (ImGuiTextBuffer*)ImGui::MemAlloc(sizeof(ImGuiTextBuffer));
        IM_PLACEMENT_NEW(g.LogClipboard) ImGuiTextBuffer();

        IM_ASSERT(g.Settings.empty());
        LoadSettings();
        g.Initialized = true;
    }

    SetCurrentFont(g.IO.Fonts->Fonts[0]);

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.Tooltip[0] = '\0';
    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.RenderDrawData.Valid = false;
    g.RenderDrawData.CmdLists = NULL;
    g.RenderDrawData.CmdListsCount = g.RenderDrawData.TotalVtxCount = g.RenderDrawData.TotalIdxCount = 0;

    // Update inputs state
    if (g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0)
        g.IO.MousePos = ImVec2(-9999.0f, -9999.0f);
    if ((g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0) || (g.IO.MousePosPrev.x < 0 && g.IO.MousePosPrev.y < 0))   // if mouse just appeared or disappeared (negative coordinate) we cancel out movement in MouseDelta
        g.IO.MouseDelta = ImVec2(0.0f, 0.0f);
    else
        g.IO.MouseDelta = g.IO.MousePos - g.IO.MousePosPrev;
    g.IO.MousePosPrev = g.IO.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        g.IO.MouseClicked[i] = g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] < 0.0f;
        g.IO.MouseReleased[i] = !g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] >= 0.0f;
        g.IO.MouseDownDurationPrev[i] = g.IO.MouseDownDuration[i];
        g.IO.MouseDownDuration[i] = g.IO.MouseDown[i] ? (g.IO.MouseDownDuration[i] < 0.0f ? 0.0f : g.IO.MouseDownDuration[i] + g.IO.DeltaTime) : -1.0f;
        g.IO.MouseDoubleClicked[i] = false;
        if (g.IO.MouseClicked[i])
        {
            if (g.Time - g.IO.MouseClickedTime[i] < g.IO.MouseDoubleClickTime)
            {
                if (ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]) < g.IO.MouseDoubleClickMaxDist * g.IO.MouseDoubleClickMaxDist)
                    g.IO.MouseDoubleClicked[i] = true;
                g.IO.MouseClickedTime[i] = -FLT_MAX;    // so the third click isn't turned into a double-click
            }
            else
            {
                g.IO.MouseClickedTime[i] = g.Time;
            }
            g.IO.MouseClickedPos[i] = g.IO.MousePos;
            g.IO.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (g.IO.MouseDown[i])
        {
            g.IO.MouseDragMaxDistanceSqr[i] = ImMax(g.IO.MouseDragMaxDistanceSqr[i], ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]));
        }
    }
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = 1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame));

    // Clear reference to active widget if the widget isn't alive anymore
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        SetActiveID(0);
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;

    // Handle user moving window (at the beginning of the frame to avoid input lag or sheering). Only valid for root windows.
    if (g.MovedWindowMoveId && g.MovedWindowMoveId == g.ActiveId)
    {
        KeepAliveID(g.MovedWindowMoveId);
        IM_ASSERT(g.MovedWindow && g.MovedWindow->RootWindow);
        IM_ASSERT(g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId);
        if (g.IO.MouseDown[0])
        {
            if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoMove))
            {
                g.MovedWindow->PosFloat += g.IO.MouseDelta;
                if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoSavedSettings))
                    MarkSettingsDirty();
            }
            FocusWindow(g.MovedWindow);
        }
        else
        {
            SetActiveID(0);
            g.MovedWindow = NULL;
            g.MovedWindowMoveId = 0;
        }
    }
    else
    {
        g.MovedWindow = NULL;
        g.MovedWindowMoveId = 0;
    }

    // Delay saving settings so we don't spam disk too much
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveSettings();
    }

    // Find the window we are hovering. Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow
    g.HoveredWindow = g.MovedWindow ? g.MovedWindow : FindHoveredWindow(g.IO.MousePos, false);
    if (g.HoveredWindow && (g.HoveredWindow->Flags & ImGuiWindowFlags_ChildWindow))
        g.HoveredRootWindow = g.HoveredWindow->RootWindow;
    else
        g.HoveredRootWindow = g.MovedWindow ? g.MovedWindow->RootWindow : FindHoveredWindow(g.IO.MousePos, true);

    if (ImGuiWindow* modal_window = GetFrontMostModalRootWindow())
    {
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
        ImGuiWindow* window = g.HoveredRootWindow;
        while (window && window != modal_window)
            window = window->ParentWindow;
        if (!window)
            g.HoveredRootWindow = g.HoveredWindow = NULL;
    }
    else
    {
        g.ModalWindowDarkeningRatio = 0.0f;
    }

    // Are we using inputs? Tell user so they can capture/discard the inputs away from the rest of their application.
    // When clicking outside of a window we assume the click is owned by the application and won't request capture. We need to track click ownership.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[mouse_earliest_button_down] > g.IO.MouseClickedTime[i])
                mouse_earliest_button_down = i;
    }
    bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];
    if (g.CaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.CaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.ActiveId != 0) || (!g.OpenPopupStack.empty());
    g.IO.WantCaptureKeyboard = (g.CaptureKeyboardNextFrame != -1) ? (g.CaptureKeyboardNextFrame != 0) : (g.ActiveId != 0);
    g.IO.WantTextInput = (g.ActiveId != 0 && g.InputTextState.Id == g.ActiveId);
    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.CaptureMouseNextFrame = g.CaptureKeyboardNextFrame = -1;
    g.OsImePosRequest = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    if (!mouse_avail_to_imgui)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Scale & Scrolling
    if (g.HoveredWindow && g.IO.MouseWheel != 0.0f && !g.HoveredWindow->Collapsed)
    {
        ImGuiWindow* window = g.HoveredWindow;
        if (g.IO.KeyCtrl)
        {
            if (g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->PosFloat += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
        }
        else if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
        {
            // Scroll
            const int scroll_lines = (window->Flags & ImGuiWindowFlags_ComboBox) ? 3 : 5;
            SetWindowScrollY(window, window->Scroll.y - g.IO.MouseWheel * window->CalcFontSize() * scroll_lines);
        }
    }

    // Pressing TAB activate widget focus
    // NB: Don't discard FocusedWindow if it isn't active, so that a window that go on/off programatically won't lose its keyboard focus.
    if (g.ActiveId == 0 && g.FocusedWindow != NULL && g.FocusedWindow->Active && IsKeyPressedMap(ImGuiKey_Tab, false))
        g.FocusedWindow->FocusIdxTabRequestNext = 0;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->Accessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.FocusedWindow && !g.FocusedWindow->WasActive)
        for (int i = g.Windows.Size-1; i >= 0; i--)
            if (g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
            {
                FocusWindow(g.Windows[i]);
                break;
            }

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    CloseInactivePopups();

    // Create implicit window - we will only render it if the user has added something to it.
    ImGui::SetNextWindowSize(ImVec2(400,400), ImGuiSetCond_FirstUseEver);
    ImGui::Begin("Debug");
}